

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFObject_private.hh
# Opt level: O1

bool __thiscall QPDFObject::getDescription(QPDFObject *this,QPDF **a_qpdf,string *description)

{
  string local_38;
  
  *a_qpdf = this->qpdf;
  getDescription_abi_cxx11_(&local_38,this);
  std::__cxx11::string::operator=((string *)description,(string *)&local_38);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  return this->qpdf != (QPDF *)0x0;
}

Assistant:

bool
    getDescription(QPDF*& a_qpdf, std::string& description)
    {
        a_qpdf = qpdf;
        description = getDescription();
        return qpdf != nullptr;
    }